

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_rtd(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 addr;
  TCGContext_conflict2 *pTVar2;
  TCGv_i32 *ppTVar3;
  uint32_t uVar4;
  TCGTemp *pTVar5;
  TCGv_i32 *ppTVar6;
  TCGContext_conflict2 *tcg_ctx;
  TCGContext_conflict2 *s_00;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar4 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  if ((s->writeback_mask & 0x80) == 0) {
    s_00 = s->uc->tcg_ctx;
    ppTVar6 = s_00->cpu_aregs;
  }
  else {
    ppTVar6 = s->writeback;
    s_00 = s->uc->tcg_ctx;
  }
  addr = ppTVar6[7];
  uVar1 = ((s->base).tb)->flags;
  pTVar5 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  tcg_gen_qemu_ld_i32_m68k
            (s_00,(TCGv_i32)((long)pTVar5 - (long)s_00),addr,(ulong)((uVar1 >> 0xd & 1) == 0),
             MO_BEUL);
  if ((s->writeback_mask & 0x80) == 0) {
    pTVar2 = s->uc->tcg_ctx;
    ppTVar3 = pTVar2->cpu_aregs;
    ppTVar6 = pTVar2->cpu_aregs;
  }
  else {
    ppTVar3 = s->writeback;
    ppTVar6 = s->writeback;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx_00,ppTVar3[7],ppTVar6[7],(short)uVar4 + 4);
  gen_jmp(s,(TCGv_i32)((long)pTVar5 - (long)s_00));
  return;
}

Assistant:

DISAS_INSN(rtd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;
    int16_t offset = read_im16(env, s);

    tmp = gen_load(s, OS_LONG, QREG_SP, 0, IS_USER(s));
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, QREG_SP, offset + 4);
    gen_jmp(s, tmp);
}